

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_conversion.cpp
# Opt level: O3

string * skiwi::get_variable_name_before_alpha
                   (string *__return_storage_ptr__,string *variable_name_after_alpha)

{
  long *plVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  string alpha_index_nr;
  long *local_38;
  ulong local_30;
  long local_28 [2];
  
  lVar2 = std::__cxx11::string::rfind((char)variable_name_after_alpha,0x5f);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)variable_name_after_alpha);
  if (lVar2 == -1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&local_38,(ulong)variable_name_after_alpha);
  if (local_30 != 0) {
    plVar1 = (long *)((long)local_38 + local_30);
    plVar3 = local_38;
    if (0 < (long)local_30 >> 2) {
      plVar3 = (long *)((long)local_38 + (local_30 & 0xfffffffffffffffc));
      lVar2 = ((long)local_30 >> 2) + 1;
      plVar4 = (long *)((long)local_38 + 3);
      do {
        if ((int)*(char *)((long)plVar4 + -3) - 0x3aU < 0xfffffff6) {
          plVar4 = (long *)((long)plVar4 + -3);
          goto LAB_0017db28;
        }
        if ((int)*(char *)((long)plVar4 + -2) - 0x3aU < 0xfffffff6) {
          plVar4 = (long *)((long)plVar4 + -2);
          goto LAB_0017db28;
        }
        if ((int)*(char *)((long)plVar4 + -1) - 0x3aU < 0xfffffff6) {
          plVar4 = (long *)((long)plVar4 + -1);
          goto LAB_0017db28;
        }
        if ((int)(char)*plVar4 - 0x3aU < 0xfffffff6) goto LAB_0017db28;
        lVar2 = lVar2 + -1;
        plVar4 = (long *)((long)plVar4 + 4);
      } while (1 < lVar2);
    }
    lVar2 = (long)plVar1 - (long)plVar3;
    if (lVar2 == 1) {
LAB_0017db07:
      plVar4 = plVar3;
      if (0xfffffff5 < (int)(char)*plVar3 - 0x3aU) {
        plVar4 = plVar1;
      }
    }
    else if (lVar2 == 2) {
LAB_0017daf9:
      plVar4 = plVar3;
      if (0xfffffff5 < (int)(char)*plVar3 - 0x3aU) {
        plVar3 = (long *)((long)plVar3 + 1);
        goto LAB_0017db07;
      }
    }
    else {
      if (lVar2 != 3) goto LAB_0017db3c;
      plVar4 = plVar3;
      if (0xfffffff5 < (int)(char)*plVar3 - 0x3aU) {
        plVar3 = (long *)((long)plVar3 + 1);
        goto LAB_0017daf9;
      }
    }
LAB_0017db28:
    if (plVar4 == plVar1) goto LAB_0017db3c;
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
LAB_0017db3c:
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_variable_name_before_alpha(const std::string& variable_name_after_alpha)
  {
  auto pos = variable_name_after_alpha.find_last_of('_');
  std::string name_before_alpha_conversion = variable_name_after_alpha.substr(0, pos);
  if (pos != std::string::npos)
    {
    std::string alpha_index_nr = variable_name_after_alpha.substr(pos + 1);
    bool is_number = !alpha_index_nr.empty() &&
      std::find_if(alpha_index_nr.begin(), alpha_index_nr.end(), [](char c) { return !std::isdigit(c); }) == alpha_index_nr.end();
    if (!is_number)
      name_before_alpha_conversion = variable_name_after_alpha;
    }
  return name_before_alpha_conversion;
  }